

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metaf.hpp
# Opt level: O3

optional<metaf::WindGroup> *
metaf::WindGroup::parse
          (optional<metaf::WindGroup> *__return_storage_ptr__,string *group,ReportPart reportPart,
          ReportMetadata *reportMetadata)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __s;
  Direction DVar2;
  Direction DVar3;
  void *pvVar4;
  _Optional_payload<metaf::WindGroup,_true,_true,_true> *p_Var5;
  bool bVar6;
  int iVar7;
  long *plVar8;
  Type TVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  _Storage<metaf::WindGroup,_true> *p_Var13;
  ulong uVar14;
  optional<metaf::WindGroup> *poVar15;
  Unit UVar16;
  ulong uVar17;
  bool bVar18;
  byte bVar19;
  undefined4 uVar20;
  undefined4 uVar21;
  optional<metaf::Direction> oVar22;
  optional<metaf::Speed> oVar23;
  optional<metaf::Distance> wsHeight;
  optional<metaf::WindGroup> result;
  string_type local_128;
  undefined8 local_108;
  ulong local_100;
  ulong local_f8;
  ulong local_f0;
  _Storage<metaf::Direction,_true> local_e8;
  uint local_e0;
  undefined4 uStack_dc;
  undefined3 uStack_d8;
  undefined4 uStack_d5;
  uint uStack_d1;
  Type TStack_cd;
  _Storage<metaf::Distance,_true> local_c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b8;
  _Storage<metaf::WindGroup,_true> local_a8;
  char local_40;
  
  bVar19 = 0;
  if (reportPart == RMK) {
    iVar7 = std::__cxx11::string::compare((char *)group);
    if (iVar7 != 0) {
      iVar7 = std::__cxx11::string::compare((char *)group);
      if (iVar7 == 0) {
        *(undefined8 *)
         &(__return_storage_ptr__->super__Optional_base<metaf::WindGroup,_true,_true>)._M_payload.
          super__Optional_payload_base<metaf::WindGroup>._M_payload = 8;
        (__return_storage_ptr__->super__Optional_base<metaf::WindGroup,_true,_true>)._M_payload.
        super__Optional_payload_base<metaf::WindGroup>._M_payload._M_value.windDir.dirType =
             NOT_REPORTED;
        *(undefined1 *)
         ((long)&(__return_storage_ptr__->super__Optional_base<metaf::WindGroup,_true,_true>).
                 _M_payload.super__Optional_payload_base<metaf::WindGroup>._M_payload + 0x10) = 0;
        (__return_storage_ptr__->super__Optional_base<metaf::WindGroup,_true,_true>)._M_payload.
        super__Optional_payload_base<metaf::WindGroup>._M_payload._M_value.wSpeed.speedUnit = KNOTS;
        *(undefined1 *)
         ((long)&(__return_storage_ptr__->super__Optional_base<metaf::WindGroup,_true,_true>).
                 _M_payload.super__Optional_payload_base<metaf::WindGroup>._M_payload + 0x1c) = 0;
        *(undefined8 *)
         &(__return_storage_ptr__->super__Optional_base<metaf::WindGroup,_true,_true>)._M_payload.
          super__Optional_payload_base<metaf::WindGroup>._M_payload._M_value.gSpeed.speedUnit = 0;
        *(undefined1 *)
         ((long)&(__return_storage_ptr__->super__Optional_base<metaf::WindGroup,_true,_true>).
                 _M_payload.super__Optional_payload_base<metaf::WindGroup>._M_payload + 0x2c) = 0;
        *(ulong *)((long)&(__return_storage_ptr__->
                          super__Optional_base<metaf::WindGroup,_true,_true>)._M_payload.
                          super__Optional_payload_base<metaf::WindGroup>._M_payload + 0x2d) =
             (ulong)(uint3)local_a8._M_value.windType._0_3_;
        *(undefined8 *)
         ((long)&(__return_storage_ptr__->super__Optional_base<metaf::WindGroup,_true,_true>).
                 _M_payload.super__Optional_payload_base<metaf::WindGroup>._M_payload._M_value.
                 vsecBegin.dirDegrees + 1) = 0;
        p_Var5 = &(__return_storage_ptr__->super__Optional_base<metaf::WindGroup,_true,_true>).
                  _M_payload;
        *(uint *)((long)&(p_Var5->super__Optional_payload_base<metaf::WindGroup>)._M_payload + 0x3c)
             = 0;
        *(Type *)((long)&(p_Var5->super__Optional_payload_base<metaf::WindGroup>)._M_payload + 0x40)
             = NOT_REPORTED;
        *(undefined1 *)
         ((long)&(__return_storage_ptr__->super__Optional_base<metaf::WindGroup,_true,_true>).
                 _M_payload.super__Optional_payload_base<metaf::WindGroup>._M_payload + 0x54) = 0;
        *(undefined1 *)
         ((long)&(__return_storage_ptr__->super__Optional_base<metaf::WindGroup,_true,_true>).
                 _M_payload.super__Optional_payload_base<metaf::WindGroup>._M_payload + 0x60) = 0;
        (__return_storage_ptr__->super__Optional_base<metaf::WindGroup,_true,_true>)._M_payload.
        super__Optional_payload_base<metaf::WindGroup>._M_payload._M_value.incompleteText = PK;
      }
      else {
        iVar7 = std::__cxx11::string::compare((char *)group);
        if (iVar7 != 0) goto LAB_001ad055;
        *(undefined8 *)
         &(__return_storage_ptr__->super__Optional_base<metaf::WindGroup,_true,_true>)._M_payload.
          super__Optional_payload_base<metaf::WindGroup>._M_payload = 10;
        (__return_storage_ptr__->super__Optional_base<metaf::WindGroup,_true,_true>)._M_payload.
        super__Optional_payload_base<metaf::WindGroup>._M_payload._M_value.windDir.dirType =
             NOT_REPORTED;
        *(undefined1 *)
         ((long)&(__return_storage_ptr__->super__Optional_base<metaf::WindGroup,_true,_true>).
                 _M_payload.super__Optional_payload_base<metaf::WindGroup>._M_payload + 0x10) = 0;
        (__return_storage_ptr__->super__Optional_base<metaf::WindGroup,_true,_true>)._M_payload.
        super__Optional_payload_base<metaf::WindGroup>._M_payload._M_value.wSpeed.speedUnit = KNOTS;
        *(undefined1 *)
         ((long)&(__return_storage_ptr__->super__Optional_base<metaf::WindGroup,_true,_true>).
                 _M_payload.super__Optional_payload_base<metaf::WindGroup>._M_payload + 0x1c) = 0;
        *(undefined8 *)
         &(__return_storage_ptr__->super__Optional_base<metaf::WindGroup,_true,_true>)._M_payload.
          super__Optional_payload_base<metaf::WindGroup>._M_payload._M_value.gSpeed.speedUnit = 0;
        *(undefined1 *)
         ((long)&(__return_storage_ptr__->super__Optional_base<metaf::WindGroup,_true,_true>).
                 _M_payload.super__Optional_payload_base<metaf::WindGroup>._M_payload + 0x2c) = 0;
        *(ulong *)((long)&(__return_storage_ptr__->
                          super__Optional_base<metaf::WindGroup,_true,_true>)._M_payload.
                          super__Optional_payload_base<metaf::WindGroup>._M_payload + 0x2d) =
             (ulong)(uint3)local_a8._M_value.windType._0_3_;
        *(undefined8 *)
         ((long)&(__return_storage_ptr__->super__Optional_base<metaf::WindGroup,_true,_true>).
                 _M_payload.super__Optional_payload_base<metaf::WindGroup>._M_payload._M_value.
                 vsecBegin.dirDegrees + 1) = 0;
        p_Var5 = &(__return_storage_ptr__->super__Optional_base<metaf::WindGroup,_true,_true>).
                  _M_payload;
        *(uint *)((long)&(p_Var5->super__Optional_payload_base<metaf::WindGroup>)._M_payload + 0x3c)
             = 0;
        *(Type *)((long)&(p_Var5->super__Optional_payload_base<metaf::WindGroup>)._M_payload + 0x40)
             = NOT_REPORTED;
        *(undefined1 *)
         ((long)&(__return_storage_ptr__->super__Optional_base<metaf::WindGroup,_true,_true>).
                 _M_payload.super__Optional_payload_base<metaf::WindGroup>._M_payload + 0x54) = 0;
        *(undefined1 *)
         ((long)&(__return_storage_ptr__->super__Optional_base<metaf::WindGroup,_true,_true>).
                 _M_payload.super__Optional_payload_base<metaf::WindGroup>._M_payload + 0x60) = 0;
        (__return_storage_ptr__->super__Optional_base<metaf::WindGroup,_true,_true>)._M_payload.
        super__Optional_payload_base<metaf::WindGroup>._M_payload._M_value.incompleteText = WND;
      }
      goto LAB_001accbe;
    }
    *(undefined8 *)
     &(__return_storage_ptr__->super__Optional_base<metaf::WindGroup,_true,_true>)._M_payload.
      super__Optional_payload_base<metaf::WindGroup>._M_payload = 6;
LAB_001acc2d:
    (__return_storage_ptr__->super__Optional_base<metaf::WindGroup,_true,_true>)._M_payload.
    super__Optional_payload_base<metaf::WindGroup>._M_payload._M_value.windDir.dirType =
         NOT_REPORTED;
    *(undefined1 *)
     ((long)&(__return_storage_ptr__->super__Optional_base<metaf::WindGroup,_true,_true>)._M_payload
             .super__Optional_payload_base<metaf::WindGroup>._M_payload + 0x10) = 0;
    (__return_storage_ptr__->super__Optional_base<metaf::WindGroup,_true,_true>)._M_payload.
    super__Optional_payload_base<metaf::WindGroup>._M_payload._M_value.wSpeed.speedUnit = KNOTS;
    *(undefined1 *)
     ((long)&(__return_storage_ptr__->super__Optional_base<metaf::WindGroup,_true,_true>)._M_payload
             .super__Optional_payload_base<metaf::WindGroup>._M_payload + 0x1c) = 0;
    *(undefined8 *)
     &(__return_storage_ptr__->super__Optional_base<metaf::WindGroup,_true,_true>)._M_payload.
      super__Optional_payload_base<metaf::WindGroup>._M_payload._M_value.gSpeed.speedUnit = 0;
    *(undefined1 *)
     ((long)&(__return_storage_ptr__->super__Optional_base<metaf::WindGroup,_true,_true>)._M_payload
             .super__Optional_payload_base<metaf::WindGroup>._M_payload + 0x2c) = 0;
    *(ulong *)((long)&(__return_storage_ptr__->super__Optional_base<metaf::WindGroup,_true,_true>).
                      _M_payload.super__Optional_payload_base<metaf::WindGroup>._M_payload + 0x2d) =
         (ulong)(uint3)local_a8._M_value.windType._0_3_;
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->super__Optional_base<metaf::WindGroup,_true,_true>)._M_payload
             .super__Optional_payload_base<metaf::WindGroup>._M_payload._M_value.vsecBegin.
             dirDegrees + 1) = 0;
    p_Var5 = &(__return_storage_ptr__->super__Optional_base<metaf::WindGroup,_true,_true>).
              _M_payload;
    *(uint *)((long)&(p_Var5->super__Optional_payload_base<metaf::WindGroup>)._M_payload + 0x3c) = 0
    ;
    *(Type *)((long)&(p_Var5->super__Optional_payload_base<metaf::WindGroup>)._M_payload + 0x40) =
         NOT_REPORTED;
    *(undefined1 *)
     ((long)&(__return_storage_ptr__->super__Optional_base<metaf::WindGroup,_true,_true>)._M_payload
             .super__Optional_payload_base<metaf::WindGroup>._M_payload + 0x54) = 0;
    *(undefined1 *)
     ((long)&(__return_storage_ptr__->super__Optional_base<metaf::WindGroup,_true,_true>)._M_payload
             .super__Optional_payload_base<metaf::WindGroup>._M_payload + 0x60) = 0;
    (__return_storage_ptr__->super__Optional_base<metaf::WindGroup,_true,_true>)._M_payload.
    super__Optional_payload_base<metaf::WindGroup>._M_payload._M_value.incompleteText = NONE;
LAB_001accbe:
    (__return_storage_ptr__->super__Optional_base<metaf::WindGroup,_true,_true>)._M_payload.
    super__Optional_payload_base<metaf::WindGroup>._M_engaged = true;
    return __return_storage_ptr__;
  }
  if (reportPart == TAF) {
    iVar7 = std::__cxx11::string::compare((char *)group);
    if (iVar7 == 0) {
      *(undefined8 *)
       &(__return_storage_ptr__->super__Optional_base<metaf::WindGroup,_true,_true>)._M_payload.
        super__Optional_payload_base<metaf::WindGroup>._M_payload = 9;
      goto LAB_001acc2d;
    }
  }
  else {
    if (reportPart != METAR) goto LAB_001ad055;
    iVar7 = std::__cxx11::string::compare((char *)group);
    if (iVar7 == 0) {
      *(undefined8 *)
       &(__return_storage_ptr__->super__Optional_base<metaf::WindGroup,_true,_true>)._M_payload.
        super__Optional_payload_base<metaf::WindGroup>._M_payload = 5;
      (__return_storage_ptr__->super__Optional_base<metaf::WindGroup,_true,_true>)._M_payload.
      super__Optional_payload_base<metaf::WindGroup>._M_payload._M_value.windDir.dirType =
           NOT_REPORTED;
      *(undefined1 *)
       ((long)&(__return_storage_ptr__->super__Optional_base<metaf::WindGroup,_true,_true>).
               _M_payload.super__Optional_payload_base<metaf::WindGroup>._M_payload + 0x10) = 0;
      (__return_storage_ptr__->super__Optional_base<metaf::WindGroup,_true,_true>)._M_payload.
      super__Optional_payload_base<metaf::WindGroup>._M_payload._M_value.wSpeed.speedUnit = KNOTS;
      *(undefined1 *)
       ((long)&(__return_storage_ptr__->super__Optional_base<metaf::WindGroup,_true,_true>).
               _M_payload.super__Optional_payload_base<metaf::WindGroup>._M_payload + 0x1c) = 0;
      *(undefined8 *)
       &(__return_storage_ptr__->super__Optional_base<metaf::WindGroup,_true,_true>)._M_payload.
        super__Optional_payload_base<metaf::WindGroup>._M_payload._M_value.gSpeed.speedUnit = 0;
      *(undefined1 *)
       ((long)&(__return_storage_ptr__->super__Optional_base<metaf::WindGroup,_true,_true>).
               _M_payload.super__Optional_payload_base<metaf::WindGroup>._M_payload + 0x2c) = 0;
      *(ulong *)((long)&(__return_storage_ptr__->super__Optional_base<metaf::WindGroup,_true,_true>)
                        ._M_payload.super__Optional_payload_base<metaf::WindGroup>._M_payload + 0x2d
                ) = (ulong)(uint3)local_a8._M_value.windType._0_3_;
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->super__Optional_base<metaf::WindGroup,_true,_true>).
               _M_payload.super__Optional_payload_base<metaf::WindGroup>._M_payload._M_value.
               vsecBegin.dirDegrees + 1) = 0;
      p_Var5 = &(__return_storage_ptr__->super__Optional_base<metaf::WindGroup,_true,_true>).
                _M_payload;
      *(uint *)((long)&(p_Var5->super__Optional_payload_base<metaf::WindGroup>)._M_payload + 0x3c) =
           0;
      *(Type *)((long)&(p_Var5->super__Optional_payload_base<metaf::WindGroup>)._M_payload + 0x40) =
           NOT_REPORTED;
      *(undefined1 *)
       ((long)&(__return_storage_ptr__->super__Optional_base<metaf::WindGroup,_true,_true>).
               _M_payload.super__Optional_payload_base<metaf::WindGroup>._M_payload + 0x54) = 0;
      *(undefined1 *)
       ((long)&(__return_storage_ptr__->super__Optional_base<metaf::WindGroup,_true,_true>).
               _M_payload.super__Optional_payload_base<metaf::WindGroup>._M_payload + 0x60) = 0;
      (__return_storage_ptr__->super__Optional_base<metaf::WindGroup,_true,_true>)._M_payload.
      super__Optional_payload_base<metaf::WindGroup>._M_payload._M_value.incompleteText = WS;
      goto LAB_001accbe;
    }
  }
  parseVariableSector((optional<metaf::WindGroup> *)&local_a8._M_value,group);
  if (local_40 == '\x01') {
    p_Var13 = &local_a8;
    poVar15 = __return_storage_ptr__;
    for (lVar10 = 0x1a; lVar10 != 0; lVar10 = lVar10 + -1) {
      (poVar15->super__Optional_base<metaf::WindGroup,_true,_true>)._M_payload.
      super__Optional_payload_base<metaf::WindGroup>._M_payload._M_value.windType =
           (p_Var13->_M_value).windType;
      p_Var13 = (_Storage<metaf::WindGroup,_true> *)((long)p_Var13 + ((ulong)bVar19 * -2 + 1) * 4);
      poVar15 = (optional<metaf::WindGroup> *)((long)poVar15 + (ulong)bVar19 * -8 + 4);
    }
    goto LAB_001accbe;
  }
  if ((parse(std::__cxx11::string_const&,metaf::ReportPart,metaf::ReportMetadata_const&)::
       windRgx_abi_cxx11_ == '\0') &&
     (iVar7 = __cxa_guard_acquire(&parse(std::__cxx11::string_const&,metaf::ReportPart,metaf::ReportMetadata_const&)
                                   ::windRgx_abi_cxx11_), iVar7 != 0)) {
    std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
              (&parse(std::__cxx11::string_const&,metaf::ReportPart,metaf::ReportMetadata_const&)::
                windRgx_abi_cxx11_,
               "(?:WS(\\d\\d\\d)/)?(\\d\\d0|VRB|///)([1-9]?\\d\\d|//)(?:G([1-9]?\\d\\d))?([KM][TMP][HS]?)"
               ,0x10);
    __cxa_atexit(std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex,
                 &parse(std::__cxx11::string_const&,metaf::ReportPart,metaf::ReportMetadata_const&)
                  ::windRgx_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&parse(std::__cxx11::string_const&,metaf::ReportPart,metaf::ReportMetadata_const&)
                         ::windRgx_abi_cxx11_);
  }
  local_a8._19_4_ = 0;
  local_a8._M_value.wSpeed.speedUnit._3_1_ = 0;
  local_a8._M_value.gSpeed.speedValue.super__Optional_base<unsigned_int,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_int> =
       (optional<unsigned_int>)(_Optional_base<unsigned_int,_true,_true>)0x0;
  local_a8._M_value.windType._0_3_ = 0;
  local_a8._3_5_ = 0;
  local_a8._M_value.windDir.dirType._0_3_ = 0;
  local_a8._11_4_ = 0;
  local_a8._15_4_ = 0;
  __s._M_current = (group->_M_dataplus)._M_p;
  bVar6 = std::__detail::
          __regex_algo_impl<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>,char,std::__cxx11::regex_traits<char>,(std::__detail::_RegexExecutorPolicy)0,true>
                    (__s,(__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          )(__s._M_current + group->_M_string_length),
                     (match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                      *)&local_a8._M_value,
                     &parse(std::__cxx11::string_const&,metaf::ReportPart,metaf::ReportMetadata_const&)
                      ::windRgx_abi_cxx11_,0);
  if (bVar6) {
    std::__cxx11::
    match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    ::str(&local_128,
          (match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
           *)&local_a8._M_value,5);
    iVar7 = std::__cxx11::string::compare((char *)&local_128);
    bVar18 = true;
    if (iVar7 == 0) {
      UVar16 = KNOTS;
    }
    else {
      iVar7 = std::__cxx11::string::compare((char *)&local_128);
      if (iVar7 == 0) {
        UVar16 = METERS_PER_SECOND;
      }
      else {
        iVar7 = std::__cxx11::string::compare((char *)&local_128);
        bVar18 = iVar7 == 0;
        UVar16 = KILOMETERS_PER_HOUR;
      }
    }
    paVar1 = &local_128.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_128._M_dataplus._M_p != paVar1) {
      operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
    }
    if (bVar18) {
      std::__cxx11::
      match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ::str(&local_128,
            (match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
             *)&local_a8._M_value,3);
      bVar18 = true;
      local_f8 = CONCAT44(local_f8._4_4_,UVar16);
      if ((local_128._M_string_length == 0) ||
         (iVar7 = std::__cxx11::string::compare((char *)&local_128), iVar7 == 0)) {
LAB_001acdc3:
        UVar16 = KNOTS;
        local_100 = 0;
        local_108 = 0;
      }
      else {
        if (local_128._M_string_length == 3) {
          if (*local_128._M_dataplus._M_p == '0') {
LAB_001acd63:
            bVar18 = false;
            goto LAB_001acdc3;
          }
        }
        else if (local_128._M_string_length != 2) goto LAB_001acd63;
        uVar14 = 0;
        local_100 = 0;
        do {
          if (9 < (byte)(local_128._M_dataplus._M_p[uVar14] - 0x30U)) {
            bVar18 = false;
            goto LAB_001acdc3;
          }
          local_100 = (ulong)((uint)(byte)(local_128._M_dataplus._M_p[uVar14] - 0x30U) +
                             (int)local_100 * 10);
          uVar14 = uVar14 + 1;
        } while ((uVar14 & 0xffffffff) < local_128._M_string_length);
        bVar18 = true;
        local_108 = 0x100000001;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_128._M_dataplus._M_p != paVar1) {
        operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
      }
      if (bVar18) {
        local_e0 = local_e0 & 0xffffff;
        uStack_dc = 0;
        uStack_d8 = 0;
        uStack_d5 = 0;
        uStack_d1 = 0;
        TStack_cd = NOT_REPORTED;
        lVar10 = CONCAT53(local_a8._3_5_,local_a8._M_value.windType._0_3_);
        lVar11 = CONCAT17(local_a8._15_1_,
                          CONCAT43(local_a8._11_4_,local_a8._M_value.windDir.dirType._0_3_)) -
                 lVar10;
        if ((lVar11 == 0) ||
           (lVar12 = (lVar11 >> 3) * -0x5555555555555555, 0xfffffffffffffffd < lVar12 - 5U)) {
          if ((*(char *)(lVar10 + -0x38 + lVar11) != '\x01') ||
             (*(long *)(lVar10 + -0x40 + lVar11) == *(long *)(lVar10 + -0x48 + lVar11))) {
LAB_001ace6a:
            plVar8 = (long *)(lVar10 + lVar11 + -0x48);
            goto LAB_001ace71;
          }
LAB_001acf6d:
          std::__cxx11::
          match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
          ::str(&local_128,
                (match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                 *)&local_a8._M_value,2);
          oVar22 = Direction::fromDegreesString(&local_128);
          local_e8 = oVar22.super__Optional_base<metaf::Direction,_true,_true>._M_payload.
                     super__Optional_payload_base<metaf::Direction>._M_payload;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_128._M_dataplus._M_p != paVar1) {
            operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
          }
          if (((undefined1  [12])
               oVar22.super__Optional_base<metaf::Direction,_true,_true>._M_payload.
               super__Optional_payload_base<metaf::Direction> & (undefined1  [12])0x1) ==
              (undefined1  [12])0x0) goto LAB_001ad015;
          std::__cxx11::
          match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
          ::str(&local_128,
                (match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                 *)&local_a8._M_value,4);
          oVar23 = Speed::fromString(&local_128,(Unit)local_f8);
          local_f8 = oVar23.super__Optional_base<metaf::Speed,_true,_true>._M_payload.
                     super__Optional_payload_base<metaf::Speed>._8_8_;
          uVar14 = oVar23.super__Optional_base<metaf::Speed,_true,_true>._M_payload.
                   super__Optional_payload_base<metaf::Speed>._M_payload._0_8_;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_128._M_dataplus._M_p != paVar1) {
            operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
          }
          if ((local_f8 & 0x100000000) == 0) {
            uVar14 = 0;
            local_f8 = 0;
            uVar17 = 0;
            local_f0 = 0;
          }
          else {
            local_f0 = uVar14 & 0xffffff0000000000;
            uVar17 = uVar14 & 0xff00000000;
            uVar14 = uVar14 & 0xffffffff;
          }
          std::__cxx11::
          match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
          ::str(&local_128,
                (match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                 *)&local_a8._M_value,1);
          Distance::fromHeightString((optional<metaf::Distance> *)&local_c8._M_value,&local_128);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_128._M_dataplus._M_p != paVar1) {
            operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
          }
          if (local_b8._M_local_buf[0] == '\x01') {
            uVar20 = (undefined4)local_c8._0_8_;
            uVar21 = (undefined4)((ulong)local_c8._0_8_ >> 0x20);
            local_e0 = local_c8._9_4_;
            uStack_dc = CONCAT13(uStack_dc._3_1_,local_c8._M_value.distUnit._1_3_);
            TVar9 = WIND_SHEAR;
          }
          else {
            uVar20 = 0;
            uVar21 = 0;
            local_c8._M_value.dist.super__Optional_base<unsigned_int,_true,_true>._M_payload.
            super__Optional_payload_base<unsigned_int>._M_engaged = (bool)0;
            TVar9 = SURFACE_WIND;
          }
          (__return_storage_ptr__->super__Optional_base<metaf::WindGroup,_true,_true>)._M_payload.
          super__Optional_payload_base<metaf::WindGroup>._M_payload._M_value.windType = TVar9;
          (__return_storage_ptr__->super__Optional_base<metaf::WindGroup,_true,_true>)._M_payload.
          super__Optional_payload_base<metaf::WindGroup>._M_payload._M_value.windDir =
               (Direction)local_e8;
          *(int *)&(__return_storage_ptr__->super__Optional_base<metaf::WindGroup,_true,_true>).
                   _M_payload.super__Optional_payload_base<metaf::WindGroup>._M_payload._M_value.
                   wSpeed.speedValue.super__Optional_base<unsigned_int,_true,_true>._M_payload =
               (int)local_100;
          *(char *)((long)&(__return_storage_ptr__->
                           super__Optional_base<metaf::WindGroup,_true,_true>)._M_payload.
                           super__Optional_payload_base<metaf::WindGroup>._M_payload + 0x10) =
               (char)local_108;
          *(undefined1 *)
           ((long)&(__return_storage_ptr__->super__Optional_base<metaf::WindGroup,_true,_true>).
                   _M_payload.super__Optional_payload_base<metaf::WindGroup>._M_payload + 0x13) = 0;
          *(undefined2 *)
           ((long)&(__return_storage_ptr__->super__Optional_base<metaf::WindGroup,_true,_true>).
                   _M_payload.super__Optional_payload_base<metaf::WindGroup>._M_payload + 0x11) = 0;
          (__return_storage_ptr__->super__Optional_base<metaf::WindGroup,_true,_true>)._M_payload.
          super__Optional_payload_base<metaf::WindGroup>._M_payload._M_value.wSpeed.speedUnit =
               UVar16;
          (__return_storage_ptr__->super__Optional_base<metaf::WindGroup,_true,_true>)._M_payload.
          super__Optional_payload_base<metaf::WindGroup>._M_payload._M_value.gSpeed.speedValue.
          super__Optional_base<unsigned_int,_true,_true>._M_payload =
               (_Optional_payload<unsigned_int,_true,_true,_true>)(uVar17 | uVar14 | local_f0);
          (__return_storage_ptr__->super__Optional_base<metaf::WindGroup,_true,_true>)._M_payload.
          super__Optional_payload_base<metaf::WindGroup>._M_payload._M_value.gSpeed.speedUnit =
               (Unit)local_f8;
          *(ulong *)((long)&(__return_storage_ptr__->
                            super__Optional_base<metaf::WindGroup,_true,_true>)._M_payload.
                            super__Optional_payload_base<metaf::WindGroup>._M_payload + 0x24) =
               CONCAT44(uVar21,uVar20);
          *(undefined1 *)
           ((long)&(__return_storage_ptr__->super__Optional_base<metaf::WindGroup,_true,_true>).
                   _M_payload.super__Optional_payload_base<metaf::WindGroup>._M_payload + 0x2c) =
               local_c8._M_value.dist.super__Optional_base<unsigned_int,_true,_true>._M_payload.
               super__Optional_payload_base<unsigned_int>._M_engaged;
          *(ulong *)((long)&(__return_storage_ptr__->
                            super__Optional_base<metaf::WindGroup,_true,_true>)._M_payload.
                            super__Optional_payload_base<metaf::WindGroup>._M_payload + 0x2d) =
               CONCAT44(uStack_dc,local_e0);
          *(ulong *)((long)&(__return_storage_ptr__->
                            super__Optional_base<metaf::WindGroup,_true,_true>)._M_payload.
                            super__Optional_payload_base<metaf::WindGroup>._M_payload._M_value.
                            vsecBegin.dirDegrees + 1) =
               CONCAT17((undefined1)uStack_d1,CONCAT43(uStack_d5,uStack_d8));
          DVar3.dirType = TStack_cd;
          DVar3.dirDegrees = uStack_d1;
          (__return_storage_ptr__->super__Optional_base<metaf::WindGroup,_true,_true>)._M_payload.
          super__Optional_payload_base<metaf::WindGroup>._M_payload._M_value.vsecEnd = DVar3;
          *(undefined1 *)
           ((long)&(__return_storage_ptr__->super__Optional_base<metaf::WindGroup,_true,_true>).
                   _M_payload.super__Optional_payload_base<metaf::WindGroup>._M_payload + 0x54) = 0;
          *(undefined1 *)
           ((long)&(__return_storage_ptr__->super__Optional_base<metaf::WindGroup,_true,_true>).
                   _M_payload.super__Optional_payload_base<metaf::WindGroup>._M_payload + 0x60) = 0;
        }
        else {
          if ((*(char *)(lVar10 + 0x28) == '\x01') &&
             (*(long *)(lVar10 + 0x20) != *(long *)(lVar10 + 0x18))) goto LAB_001acf6d;
          if (0xfffffffffffffffa < lVar12 - 8U) goto LAB_001ace6a;
          plVar8 = (long *)(lVar10 + 0x60);
LAB_001ace71:
          if (((char)plVar8[2] == '\x01') && (plVar8[1] != *plVar8)) goto LAB_001acf6d;
          std::__cxx11::
          match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
          ::str(&local_128,
                (match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                 *)&local_a8._M_value,2);
          iVar7 = std::__cxx11::string::compare((char *)&local_128);
          if (iVar7 == 0) {
            std::__cxx11::
            match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
            ::str((string_type *)&local_c8._M_value,
                  (match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                   *)&local_a8._M_value,3);
            iVar7 = std::__cxx11::string::compare((char *)&local_c8);
            bVar18 = iVar7 == 0;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_c8._0_8_ != &local_b8) {
              operator_delete((void *)local_c8._0_8_,
                              CONCAT71(local_b8._M_allocated_capacity._1_7_,local_b8._M_local_buf[0]
                                      ) + 1);
            }
          }
          else {
            bVar18 = false;
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_128._M_dataplus._M_p != paVar1) {
            operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
          }
          if (!bVar18) goto LAB_001acf6d;
          (__return_storage_ptr__->super__Optional_base<metaf::WindGroup,_true,_true>)._M_payload.
          super__Optional_payload_base<metaf::WindGroup>._M_payload._M_value.windType =
               SURFACE_WIND_CALM;
          p_Var5 = &(__return_storage_ptr__->super__Optional_base<metaf::WindGroup,_true,_true>).
                    _M_payload;
          *(uint *)((long)&(p_Var5->super__Optional_payload_base<metaf::WindGroup>)._M_payload + 4)
               = 0;
          *(Type *)((long)&(p_Var5->super__Optional_payload_base<metaf::WindGroup>)._M_payload + 8)
               = NOT_REPORTED;
          *(int *)&(__return_storage_ptr__->super__Optional_base<metaf::WindGroup,_true,_true>).
                   _M_payload.super__Optional_payload_base<metaf::WindGroup>._M_payload._M_value.
                   wSpeed.speedValue.super__Optional_base<unsigned_int,_true,_true>._M_payload =
               (int)local_100;
          *(char *)((long)&(__return_storage_ptr__->
                           super__Optional_base<metaf::WindGroup,_true,_true>)._M_payload.
                           super__Optional_payload_base<metaf::WindGroup>._M_payload + 0x10) =
               (char)local_108;
          *(undefined1 *)
           ((long)&(__return_storage_ptr__->super__Optional_base<metaf::WindGroup,_true,_true>).
                   _M_payload.super__Optional_payload_base<metaf::WindGroup>._M_payload + 0x13) = 0;
          *(undefined2 *)
           ((long)&(__return_storage_ptr__->super__Optional_base<metaf::WindGroup,_true,_true>).
                   _M_payload.super__Optional_payload_base<metaf::WindGroup>._M_payload + 0x11) = 0;
          (__return_storage_ptr__->super__Optional_base<metaf::WindGroup,_true,_true>)._M_payload.
          super__Optional_payload_base<metaf::WindGroup>._M_payload._M_value.wSpeed.speedUnit =
               UVar16;
          *(undefined1 *)
           ((long)&(__return_storage_ptr__->super__Optional_base<metaf::WindGroup,_true,_true>).
                   _M_payload.super__Optional_payload_base<metaf::WindGroup>._M_payload + 0x2c) = 0;
          (__return_storage_ptr__->super__Optional_base<metaf::WindGroup,_true,_true>)._M_payload.
          super__Optional_payload_base<metaf::WindGroup>._M_payload._M_value.gSpeed.speedValue.
          super__Optional_base<unsigned_int,_true,_true>._M_payload =
               (_Optional_payload<unsigned_int,_true,_true,_true>)0x0;
          *(undefined8 *)
           &(__return_storage_ptr__->super__Optional_base<metaf::WindGroup,_true,_true>)._M_payload.
            super__Optional_payload_base<metaf::WindGroup>._M_payload._M_value.gSpeed.speedUnit = 0;
          *(ulong *)((long)&(__return_storage_ptr__->
                            super__Optional_base<metaf::WindGroup,_true,_true>)._M_payload.
                            super__Optional_payload_base<metaf::WindGroup>._M_payload + 0x2d) =
               CONCAT44(uStack_dc,local_e0);
          *(ulong *)((long)&(__return_storage_ptr__->
                            super__Optional_base<metaf::WindGroup,_true,_true>)._M_payload.
                            super__Optional_payload_base<metaf::WindGroup>._M_payload._M_value.
                            vsecBegin.dirDegrees + 1) =
               CONCAT17((undefined1)uStack_d1,CONCAT43(uStack_d5,uStack_d8));
          DVar2.dirType = TStack_cd;
          DVar2.dirDegrees = uStack_d1;
          (__return_storage_ptr__->super__Optional_base<metaf::WindGroup,_true,_true>)._M_payload.
          super__Optional_payload_base<metaf::WindGroup>._M_payload._M_value.vsecEnd = DVar2;
          *(undefined1 *)
           ((long)&(__return_storage_ptr__->super__Optional_base<metaf::WindGroup,_true,_true>).
                   _M_payload.super__Optional_payload_base<metaf::WindGroup>._M_payload + 0x54) = 0;
          *(undefined1 *)
           ((long)&(__return_storage_ptr__->super__Optional_base<metaf::WindGroup,_true,_true>).
                   _M_payload.super__Optional_payload_base<metaf::WindGroup>._M_payload + 0x60) = 0;
        }
        (__return_storage_ptr__->super__Optional_base<metaf::WindGroup,_true,_true>)._M_payload.
        super__Optional_payload_base<metaf::WindGroup>._M_payload._M_value.incompleteText = NONE;
        (__return_storage_ptr__->super__Optional_base<metaf::WindGroup,_true,_true>)._M_payload.
        super__Optional_payload_base<metaf::WindGroup>._M_engaged = true;
        goto LAB_001ad033;
      }
    }
LAB_001ad015:
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->super__Optional_base<metaf::WindGroup,_true,_true>)._M_payload
             .super__Optional_payload_base<metaf::WindGroup>._M_payload._M_value.rw.
             super__Optional_base<metaf::Runway,_true,_true>._M_payload + 4) = 0;
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->super__Optional_base<metaf::WindGroup,_true,_true>)._M_payload
             .super__Optional_payload_base<metaf::WindGroup>._M_payload + 100) = 0;
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->super__Optional_base<metaf::WindGroup,_true,_true>)._M_payload
             .super__Optional_payload_base<metaf::WindGroup>._M_payload + 0x50) = 0;
    (__return_storage_ptr__->super__Optional_base<metaf::WindGroup,_true,_true>)._M_payload.
    super__Optional_payload_base<metaf::WindGroup>._M_payload._M_value.rw.
    super__Optional_base<metaf::Runway,_true,_true>._M_payload.
    super__Optional_payload_base<metaf::Runway>._M_payload = 0;
    *(undefined8 *)
     &(__return_storage_ptr__->super__Optional_base<metaf::WindGroup,_true,_true>)._M_payload.
      super__Optional_payload_base<metaf::WindGroup>._M_payload._M_value.vsecEnd.dirType = 0;
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->super__Optional_base<metaf::WindGroup,_true,_true>)._M_payload
             .super__Optional_payload_base<metaf::WindGroup>._M_payload + 0x48) = 0;
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->super__Optional_base<metaf::WindGroup,_true,_true>)._M_payload
             .super__Optional_payload_base<metaf::WindGroup>._M_payload + 0x30) = 0;
    *(undefined8 *)
     &(__return_storage_ptr__->super__Optional_base<metaf::WindGroup,_true,_true>)._M_payload.
      super__Optional_payload_base<metaf::WindGroup>._M_payload._M_value.vsecBegin.dirType = 0;
    *(undefined8 *)
     &(__return_storage_ptr__->super__Optional_base<metaf::WindGroup,_true,_true>)._M_payload.
      super__Optional_payload_base<metaf::WindGroup>._M_payload._M_value.gSpeed.speedUnit = 0;
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->super__Optional_base<metaf::WindGroup,_true,_true>)._M_payload
             .super__Optional_payload_base<metaf::WindGroup>._M_payload + 0x28) = 0;
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->super__Optional_base<metaf::WindGroup,_true,_true>)._M_payload
             .super__Optional_payload_base<metaf::WindGroup>._M_payload._M_value.wSpeed.speedValue.
             super__Optional_base<unsigned_int,_true,_true> + 4) = 0;
    (__return_storage_ptr__->super__Optional_base<metaf::WindGroup,_true,_true>)._M_payload.
    super__Optional_payload_base<metaf::WindGroup>._M_payload._M_value.gSpeed.speedValue.
    super__Optional_base<unsigned_int,_true,_true>._M_payload =
         (_Optional_payload<unsigned_int,_true,_true,_true>)0x0;
    *(undefined8 *)
     &(__return_storage_ptr__->super__Optional_base<metaf::WindGroup,_true,_true>)._M_payload.
      super__Optional_payload_base<metaf::WindGroup>._M_payload = 0;
    *(undefined8 *)
     &(__return_storage_ptr__->super__Optional_base<metaf::WindGroup,_true,_true>)._M_payload.
      super__Optional_payload_base<metaf::WindGroup>._M_payload._M_value.windDir.dirType = 0;
  }
LAB_001ad033:
  pvVar4 = (void *)CONCAT53(local_a8._3_5_,local_a8._M_value.windType._0_3_);
  if (pvVar4 != (void *)0x0) {
    operator_delete(pvVar4,CONCAT17(local_a8._M_value.wSpeed.speedUnit._3_1_,
                                    CONCAT43(local_a8._19_4_,local_a8._16_3_)) - (long)pvVar4);
  }
  if (bVar6) {
    return __return_storage_ptr__;
  }
LAB_001ad055:
  *(undefined8 *)
   ((long)&(__return_storage_ptr__->super__Optional_base<metaf::WindGroup,_true,_true>)._M_payload.
           super__Optional_payload_base<metaf::WindGroup>._M_payload._M_value.rw.
           super__Optional_base<metaf::Runway,_true,_true>._M_payload + 4) = 0;
  *(undefined8 *)
   ((long)&(__return_storage_ptr__->super__Optional_base<metaf::WindGroup,_true,_true>)._M_payload.
           super__Optional_payload_base<metaf::WindGroup>._M_payload + 100) = 0;
  *(undefined8 *)
   ((long)&(__return_storage_ptr__->super__Optional_base<metaf::WindGroup,_true,_true>)._M_payload.
           super__Optional_payload_base<metaf::WindGroup>._M_payload + 0x50) = 0;
  (__return_storage_ptr__->super__Optional_base<metaf::WindGroup,_true,_true>)._M_payload.
  super__Optional_payload_base<metaf::WindGroup>._M_payload._M_value.rw.
  super__Optional_base<metaf::Runway,_true,_true>._M_payload.
  super__Optional_payload_base<metaf::Runway>._M_payload = 0;
  *(undefined8 *)
   &(__return_storage_ptr__->super__Optional_base<metaf::WindGroup,_true,_true>)._M_payload.
    super__Optional_payload_base<metaf::WindGroup>._M_payload._M_value.vsecEnd.dirType = 0;
  *(undefined8 *)
   ((long)&(__return_storage_ptr__->super__Optional_base<metaf::WindGroup,_true,_true>)._M_payload.
           super__Optional_payload_base<metaf::WindGroup>._M_payload + 0x48) = 0;
  *(undefined8 *)
   ((long)&(__return_storage_ptr__->super__Optional_base<metaf::WindGroup,_true,_true>)._M_payload.
           super__Optional_payload_base<metaf::WindGroup>._M_payload + 0x30) = 0;
  *(undefined8 *)
   &(__return_storage_ptr__->super__Optional_base<metaf::WindGroup,_true,_true>)._M_payload.
    super__Optional_payload_base<metaf::WindGroup>._M_payload._M_value.vsecBegin.dirType = 0;
  *(undefined8 *)
   &(__return_storage_ptr__->super__Optional_base<metaf::WindGroup,_true,_true>)._M_payload.
    super__Optional_payload_base<metaf::WindGroup>._M_payload._M_value.gSpeed.speedUnit = 0;
  *(undefined8 *)
   ((long)&(__return_storage_ptr__->super__Optional_base<metaf::WindGroup,_true,_true>)._M_payload.
           super__Optional_payload_base<metaf::WindGroup>._M_payload + 0x28) = 0;
  *(undefined8 *)
   ((long)&(__return_storage_ptr__->super__Optional_base<metaf::WindGroup,_true,_true>)._M_payload.
           super__Optional_payload_base<metaf::WindGroup>._M_payload._M_value.wSpeed.speedValue.
           super__Optional_base<unsigned_int,_true,_true> + 4) = 0;
  (__return_storage_ptr__->super__Optional_base<metaf::WindGroup,_true,_true>)._M_payload.
  super__Optional_payload_base<metaf::WindGroup>._M_payload._M_value.gSpeed.speedValue.
  super__Optional_base<unsigned_int,_true,_true>._M_payload =
       (_Optional_payload<unsigned_int,_true,_true,_true>)0x0;
  *(undefined8 *)
   &(__return_storage_ptr__->super__Optional_base<metaf::WindGroup,_true,_true>)._M_payload.
    super__Optional_payload_base<metaf::WindGroup>._M_payload = 0;
  *(undefined8 *)
   &(__return_storage_ptr__->super__Optional_base<metaf::WindGroup,_true,_true>)._M_payload.
    super__Optional_payload_base<metaf::WindGroup>._M_payload._M_value.windDir.dirType = 0;
  return __return_storage_ptr__;
}

Assistant:

std::optional<WindGroup> WindGroup::parse(const std::string & group,
		ReportPart reportPart,
		const ReportMetadata & reportMetadata)
{
	(void)reportMetadata;
	static const std::optional<WindGroup> notRecognised;

	if (reportPart == ReportPart::METAR) {
		if (group == "WS") return WindGroup(Type::WIND_SHEAR_IN_LOWER_LAYERS, IncompleteText::WS);
	}
	if (reportPart == ReportPart::TAF) {
		if (group == "WSCONDS") return WindGroup(Type::WSCONDS);
	}
	if (reportPart == ReportPart::RMK) {
		if (group == "WSHFT") return WindGroup(Type::WIND_SHIFT);
		if (group == "PK") return WindGroup(Type::PEAK_WIND, IncompleteText::PK);
		if (group == "WND") return WindGroup(Type::WND_MISG, IncompleteText::WND);
	}

	if (reportPart != ReportPart::METAR &&
		reportPart != ReportPart::TAF) return notRecognised;

	if (const auto result = parseVariableSector(group); result.has_value())
		return *result;

	static const std::regex windRgx("(?:WS(\\d\\d\\d)/)?"
		"(\\d\\d0|VRB|///)([1-9]?\\d\\d|//)(?:G([1-9]?\\d\\d))?([KM][TMP][HS]?)");
	static const auto matchWindShearHeight = 1, matchWindDir = 2;
	static const auto matchWindSpeed = 3, matchWindGust = 4, matchWindUnit = 5;

	// Surface wind or wind shear, e.g. dd0ssKT or dd0ssGggMPS or WShhhdd0ssGggKT
	if (std::smatch match; std::regex_match(group, match, windRgx)) {
		const auto speedUnit = Speed::unitFromString(match.str(matchWindUnit));
		if (!speedUnit.has_value()) return notRecognised;
		const auto speed = Speed::fromString(match.str(matchWindSpeed), *speedUnit);
		if (!speed.has_value()) return notRecognised;

		WindGroup result;

		if (!match.length(matchWindShearHeight) && 
			!match.length(matchWindGust) &&
			match.str(matchWindDir) == "000" &&
			match.str(matchWindSpeed) == "00")
		{
			//00000KT or 00000MPS or 00000KMH: calm wind
			result.windType = Type::SURFACE_WIND_CALM;
			result.wSpeed = *speed;
			return result;
		}

		const auto dir = Direction::fromDegreesString(match.str(matchWindDir));
		if (!dir.has_value()) return notRecognised;
		result.windDir = *dir;
		result.wSpeed = *speed;
		const auto gust = Speed::fromString(match.str(matchWindGust), *speedUnit);
		if (gust.has_value()) result.gSpeed = *gust;
		const auto wsHeight = Distance::fromHeightString(match.str(matchWindShearHeight));
		result.windType = Type::SURFACE_WIND;
		if (wsHeight.has_value()) {
			result.windType = Type::WIND_SHEAR;
			result.wShHeight = *wsHeight;
		}
		return result;
	}

	return notRecognised;
}